

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# licm_pass.cpp
# Opt level: O0

Status __thiscall
spvtools::opt::LICMPass::AnalyseAndHoistFromBB
          (LICMPass *this,Loop *loop,Function *f,BasicBlock *bb,
          vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
          *loop_bbs)

{
  bool bVar1;
  IRContext *this_00;
  DominatorAnalysis *this_01;
  DominatorTree *this_02;
  DominatorTreeNode *pDVar2;
  reference ppDVar3;
  DominatorTreeNode *child_dom_tree_node;
  iterator __end2;
  iterator __begin2;
  DominatorTreeNode *__range2;
  DominatorTree *dom_tree;
  DominatorAnalysis *dom_analysis;
  anon_class_24_3_1494366a local_78;
  undefined1 local_60 [8];
  function<bool_(spvtools::opt::Instruction_*)> hoist_inst;
  bool modified;
  vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_> *loop_bbs_local;
  BasicBlock *bb_local;
  Function *f_local;
  Loop *loop_local;
  LICMPass *this_local;
  
  hoist_inst._M_invoker._7_1_ = 0;
  local_78.loop = (Loop **)&f_local;
  local_78.modified = (bool *)((long)&hoist_inst._M_invoker + 7);
  local_78.this = this;
  f_local = (Function *)loop;
  loop_local = (Loop *)this;
  std::function<bool(spvtools::opt::Instruction*)>::
  function<spvtools::opt::LICMPass::AnalyseAndHoistFromBB(spvtools::opt::Loop*,spvtools::opt::Function*,spvtools::opt::BasicBlock*,std::vector<spvtools::opt::BasicBlock*,std::allocator<spvtools::opt::BasicBlock*>>*)::__0,void>
            ((function<bool(spvtools::opt::Instruction*)> *)local_60,&local_78);
  bVar1 = IsImmediatelyContainedInLoop(this,(Loop *)f_local,f,bb);
  if ((!bVar1) ||
     (bVar1 = BasicBlock::WhileEachInst
                        (bb,(function<bool_(spvtools::opt::Instruction_*)> *)local_60,false), bVar1)
     ) {
    this_00 = Pass::context(&this->super_Pass);
    this_01 = IRContext::GetDominatorAnalysis(this_00,f);
    this_02 = DominatorAnalysisBase::GetDomTree(&this_01->super_DominatorAnalysisBase);
    pDVar2 = DominatorTree::GetTreeNode(this_02,bb);
    __end2 = DominatorTreeNode::begin(pDVar2);
    child_dom_tree_node = (DominatorTreeNode *)DominatorTreeNode::end(pDVar2);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>
                                       *)&child_dom_tree_node), bVar1) {
      ppDVar3 = __gnu_cxx::
                __normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>
                ::operator*(&__end2);
      pDVar2 = *ppDVar3;
      bVar1 = Loop::IsInsideLoop((Loop *)f_local,pDVar2->bb_);
      if (bVar1) {
        std::vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>::
        push_back(loop_bbs,&pDVar2->bb_);
      }
      __gnu_cxx::
      __normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>
      ::operator++(&__end2);
    }
    this_local._4_4_ = SuccessWithoutChange;
    if ((hoist_inst._M_invoker._7_1_ & 1) != 0) {
      this_local._4_4_ = SuccessWithChange;
    }
  }
  else {
    this_local._4_4_ = Failure;
  }
  std::function<bool_(spvtools::opt::Instruction_*)>::~function
            ((function<bool_(spvtools::opt::Instruction_*)> *)local_60);
  return this_local._4_4_;
}

Assistant:

Pass::Status LICMPass::AnalyseAndHoistFromBB(
    Loop* loop, Function* f, BasicBlock* bb,
    std::vector<BasicBlock*>* loop_bbs) {
  bool modified = false;
  std::function<bool(Instruction*)> hoist_inst =
      [this, &loop, &modified](Instruction* inst) {
        if (loop->ShouldHoistInstruction(*inst)) {
          if (!HoistInstruction(loop, inst)) {
            return false;
          }
          modified = true;
        }
        return true;
      };

  if (IsImmediatelyContainedInLoop(loop, f, bb)) {
    if (!bb->WhileEachInst(hoist_inst, false)) {
      return Status::Failure;
    }
  }

  DominatorAnalysis* dom_analysis = context()->GetDominatorAnalysis(f);
  DominatorTree& dom_tree = dom_analysis->GetDomTree();

  for (DominatorTreeNode* child_dom_tree_node : *dom_tree.GetTreeNode(bb)) {
    if (loop->IsInsideLoop(child_dom_tree_node->bb_)) {
      loop_bbs->push_back(child_dom_tree_node->bb_);
    }
  }

  return (modified ? Status::SuccessWithChange : Status::SuccessWithoutChange);
}